

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightweightsemaphore.h
# Opt level: O1

bool __thiscall
duckdb_moodycamel::LightweightSemaphore::waitWithPartialSpinning
          (LightweightSemaphore *this,int64_t timeout_usecs)

{
  Semaphore *this_00;
  long lVar1;
  bool bVar2;
  __pid_t _Var3;
  int iVar4;
  bool bVar5;
  
  iVar4 = -10000;
  do {
    lVar1 = (this->m_count).super___atomic_base<long>._M_i;
    if (0 < lVar1) {
      LOCK();
      bVar5 = lVar1 == (this->m_count).super___atomic_base<long>._M_i;
      if (bVar5) {
        (this->m_count).super___atomic_base<long>._M_i = lVar1 + -1;
      }
      UNLOCK();
      if (bVar5) {
        return true;
      }
    }
    iVar4 = iVar4 + 1;
    if (iVar4 == 0) {
      LOCK();
      lVar1 = (this->m_count).super___atomic_base<long>._M_i;
      (this->m_count).super___atomic_base<long>._M_i =
           (this->m_count).super___atomic_base<long>._M_i + -1;
      UNLOCK();
      bVar5 = true;
      if (SBORROW8(lVar1,1) != (this->m_count).super___atomic_base<long>._M_i < 0) {
        this_00 = &this->m_sema;
        if (timeout_usecs < 0) {
          _Var3 = details::Semaphore::wait(this_00,(void *)timeout_usecs);
          return SUB41(_Var3,0);
        }
        bVar2 = details::Semaphore::timed_wait(this_00,timeout_usecs);
        if (!bVar2) {
          do {
            do {
              lVar1 = (this->m_count).super___atomic_base<long>._M_i;
              if ((-1 < lVar1) && (bVar5 = details::Semaphore::try_wait(this_00), bVar5)) {
                return true;
              }
            } while (-1 < lVar1);
            LOCK();
            bVar5 = lVar1 == (this->m_count).super___atomic_base<long>._M_i;
            if (bVar5) {
              (this->m_count).super___atomic_base<long>._M_i = lVar1 + 1;
            }
            UNLOCK();
          } while (!bVar5);
          bVar5 = false;
        }
      }
      return bVar5;
    }
  } while( true );
}

Assistant:

bool waitWithPartialSpinning(std::int64_t timeout_usecs = -1)
	{
		ssize_t oldCount;
		// Is there a better way to set the initial spin count?
		// If we lower it to 1000, testBenaphore becomes 15x slower on my Core i7-5930K Windows PC,
		// as threads start hitting the kernel semaphore.
		int spin = 10000;
		while (--spin >= 0)
		{
			oldCount = m_count.load(std::memory_order_relaxed);
			if ((oldCount > 0) && m_count.compare_exchange_strong(oldCount, oldCount - 1, std::memory_order_acquire, std::memory_order_relaxed))
				return true;
			std::atomic_signal_fence(std::memory_order_acquire);	 // Prevent the compiler from collapsing the loop.
		}
		oldCount = m_count.fetch_sub(1, std::memory_order_acquire);
		if (oldCount > 0)
			return true;
		if (timeout_usecs < 0)
			return m_sema.wait();
		if (m_sema.timed_wait((std::uint64_t)timeout_usecs))
			return true;
		// At this point, we've timed out waiting for the semaphore, but the
		// count is still decremented indicating we may still be waiting on
		// it. So we have to re-adjust the count, but only if the semaphore
		// wasn't signaled enough times for us too since then. If it was, we
		// need to release the semaphore too.
		while (true)
		{
			oldCount = m_count.load(std::memory_order_acquire);
			if (oldCount >= 0 && m_sema.try_wait())
				return true;
			if (oldCount < 0 && m_count.compare_exchange_strong(oldCount, oldCount + 1, std::memory_order_relaxed, std::memory_order_relaxed))
				return false;
		}
	}